

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
int_writer<int,_duckdb_fmt::v6::basic_format_specs<char>_>::on_bin
          (int_writer<int,_duckdb_fmt::v6::basic_format_specs<char>_> *this)

{
  char cVar1;
  format_specs *pfVar2;
  bool bVar3;
  int num_digits;
  bin_writer<1> f;
  uint uVar4;
  string_view prefix;
  
  pfVar2 = this->specs;
  if ((char)pfVar2->field_0x9 < '\0') {
    uVar4 = this->prefix_size;
    this->prefix_size = uVar4 + 1;
    this->prefix[uVar4] = '0';
    cVar1 = pfVar2->type;
    uVar4 = this->prefix_size;
    this->prefix_size = uVar4 + 1;
    this->prefix[uVar4] = cVar1;
  }
  f.num_digits = 0;
  f.abs_value = this->abs_value;
  num_digits = 0;
  uVar4 = this->abs_value;
  do {
    f = (bin_writer<1>)((long)f + 0x100000000);
    num_digits = num_digits + 1;
    bVar3 = 1 < uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar3);
  prefix.data_ = this->prefix;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.size_._4_4_ = 0;
  basic_writer<duckdb_fmt::v6::buffer_range<char>>::
  write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<int,duckdb_fmt::v6::basic_format_specs<char>>::bin_writer<1>>
            ((basic_writer<duckdb_fmt::v6::buffer_range<char>> *)this->writer,num_digits,prefix,
             *pfVar2,f);
  return;
}

Assistant:

void on_bin() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(specs.type);
      }
      int num_digits = count_digits<1>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<1>{abs_value, num_digits});
    }